

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall
AnalyserUnits_fabbriFantiniWildersSeveriHumanSanModel2017WithIncompatibleUnits_Test::TestBody
          (AnalyserUnits_fabbriFantiniWildersSeveriHumanSanModel2017WithIncompatibleUnits_Test *this
          )

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_806;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  ScopedTrace local_1e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  undefined1 local_1d8 [32];
  string local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38 [2];
  long local_28 [2];
  
  libcellml::Parser::create(SUB81(local_1a8,0));
  local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,
             "analyser/units/fabbri_fantini_wilders_severi_human_san_model_2017_with_incompatible_units.cellml"
             ,"");
  fileContents((string *)&local_198);
  libcellml::Parser::parseModel(local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1d8._16_8_)->_M_p + 1));
  }
  local_1d8._0_8_ = (pointer)0x0;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_198,"size_t(0)","parser->issueCount()",(unsigned_long *)local_1d8,
             (unsigned_long *)&local_1e8);
  if ((char)local_198._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_1d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_198._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x311,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((pointer)local_1d8._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_1d8._0_8_)->_M_p + 8))();
      }
      local_1d8._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_198._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,
             "The unit of \'1.2\' in \'pow(Km_Kp/Ko, 1.2)\' in \'1.0+pow(Km_Kp/Ko, 1.2)\' in \'pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)\' in \'pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)\' in \'i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)\' in \'Iso_increase*i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)\' in equation \'i_NaK = Iso_increase*i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)\' in component \'i_NaK\' is not dimensionless. \'1.2\' is in \'second\'."
             ,"");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,
             "The units in \'ACh > 0.0\' in \'(ACh > 0.0)?0.7*ACh/(0.00009+ACh)\' in \'(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0\' in \'(Iso_1_uM > 0.0)?-0.25:(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0\' in equation \'b_up = (Iso_1_uM > 0.0)?-0.25:(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0\' in component \'Ca_intracellular_fluxes\' are not equivalent. \'ACh\' is in \'millimolar\' (i.e. \'metre^-3 x mole\') while \'0.0\' is in \'millimolar4\' (i.e. \'metre^-12 x mole^4\')."
             ,"");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,
             "The units in \'-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)\' in \'(ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)\' in \'(ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423):0.0\' in equation \'ACh_shift = (ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423):0.0\' in component \'i_f_y_gate\' are not equivalent. \'-1.0\' is in \'millivolt\' (i.e. \'10^-3 x ampere^-1 x kilogram x metre^2 x second^-3\') while \'9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,"");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,
             "The units in \'0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift)))\' in \'1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))\' in \'1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))-0.054\' in equation \'tau_y = 1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))-0.054\' in component \'i_f_y_gate\' are not equivalent. \'0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)\' is \'dimensionless\' while \'0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift)))\' is in \'millivolt x per_millivolt_second\' (i.e. \'second^-1\')."
             ,"");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,
             "The units in \'0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))\' in \'(V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))\' in \'(V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752)):0.0002501*exp(-(V-ACh_shift-Iso_shift-y_shift)/12.861)\' in equation \'y_infinity = (V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752)):0.0002501*exp(-(V-ACh_shift-Iso_shift-y_shift)/12.861)\' in component \'i_f_y_gate\' are not equivalent. \'0.01329\' is \'dimensionless\' while \'0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))\' is in \'ampere\'."
             ,"");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,
             "The units in \'V+42.0504\' in \'-(V+42.0504)\' in \'-(V+42.0504)/8.3106\' in \'exp(-(V+42.0504)/8.3106)\' in \'1.0+exp(-(V+42.0504)/8.3106)\' in \'1.0/(1.0+exp(-(V+42.0504)/8.3106))\' in equation \'m_infinity = 1.0/(1.0+exp(-(V+42.0504)/8.3106))\' in component \'i_Na_m_gate\' are not equivalent. \'V\' is in \'millivolt\' (i.e. \'10^-3 x ampere^-1 x kilogram x metre^2 x second^-3\') while \'42.0504\' is in \'per_millivolt\' (i.e. \'10^3 x ampere x kilogram^-1 x metre^-2 x second^3\')."
             ,"");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,
             "The units in \'1.0+exp((V+69.804)/4.4565)\' in \'1.0/(1.0+exp((V+69.804)/4.4565))\' in equation \'h_infinity = 1.0/(1.0+exp((V+69.804)/4.4565))\' in component \'i_Na_h_gate\' are not equivalent. \'1.0\' is \'dimensionless\' while \'exp((V+69.804)/4.4565)\' is in \'millivolt x volt^-1\' (i.e. \'10^-3\')."
             ,"");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "The units in \'320.0*exp(-0.1*(V+75.0))+1.0\' in \'2000.0/(320.0*exp(-0.1*(V+75.0))+1.0)\' in equation \'beta_h = 2000.0/(320.0*exp(-0.1*(V+75.0))+1.0)\' in component \'i_Na_h_gate\' are not equivalent. \'320.0*exp(-0.1*(V+75.0))\' is in \'millivolt x per_millivolt x per_second\' (i.e. \'second^-1\') while \'1.0\' is \'dimensionless\'."
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "The units in \'i_CaL = (i_siCa+i_siK+i_siNa)*(1.0-ACh_block)*1.0*Iso_increase\' in component \'i_CaL\' are not equivalent. \'i_CaL\' is in \'nanoA\' (i.e. \'10^-9 x ampere\') while \'(i_siCa+i_siK+i_siNa)*(1.0-ACh_block)*1.0*Iso_increase\' is in \'millivolt x nanoA\' (i.e. \'10^-12 x kilogram x metre^2 x second^-3\')."
             ,"");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "The units in \'-0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)-0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)\' in equation \'alpha_dL = -0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)-0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)\' in component \'i_CaL_dL_gate\' are not equivalent. \'-0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)\' is in \'millivolt x per_millivolt_second\' (i.e. \'second^-1\') while \'0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)\' is in \'millivolt x per_second\' (i.e. \'10^-3 x ampere^-1 x kilogram x metre^2 x second^-4\')."
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "The unit of \'-pow((V+36.0)/10.0, 2.0)\' in \'exp(-pow((V+36.0)/10.0, 2.0))\' in \'230.0*exp(-pow((V+36.0)/10.0, 2.0))\' in \'44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0))\' in \'0.001*(44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0)))\' in equation \'tau_fL = 0.001*(44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0)))\' in component \'i_CaL_fL_gate\' is not dimensionless. \'-pow((V+36.0)/10.0, 2.0)\' is in \'ampere^-2 x millivolt^2\' (i.e. \'10^-6 x ampere^-4 x kilogram^2 x metre^4 x second^-6\')."
             ,"");
  plVar4 = local_28;
  local_38[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "The units in \'i_KACh = (ACh > 0.0)?ACh_on*g_KACh*(V-E_K)*(1.0+exp((V+20.0)/20.0))*a:0.0\' in component \'i_KACh\' are not equivalent. \'i_KACh\' is in \'nanoA\' (i.e. \'10^-9 x ampere\') while \'(ACh > 0.0)?ACh_on*g_KACh*(V-E_K)*(1.0+exp((V+20.0)/20.0))*a:0.0\' is in \'microS x millivolt\' and \'ampere\' (i.e. \'10^-9 x ampere\' and \'ampere\')."
             ,"");
  __l._M_len = 0xc;
  __l._M_array = &local_198;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d8,__l,(allocator_type *)&local_1e8);
  lVar2 = -0x180;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_198._M_dataplus._M_p);
  testing::ScopedTrace::ScopedTrace
            (&local_1e9,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x326,"Issue occurred here.");
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p;
  local_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_198._M_string_length + 8) = *(int *)(local_198._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_198._M_string_length + 8) = *(int *)(local_198._M_string_length + 8) + 1;
    }
  }
  expectEqualIssues((vector *)local_1d8,(shared_ptr *)&local_1e8);
  if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
  }
  testing::ScopedTrace::~ScopedTrace(&local_1e9);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  return;
}

Assistant:

TEST(AnalyserUnits, fabbriFantiniWildersSeveriHumanSanModel2017WithIncompatibleUnits)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/fabbri_fantini_wilders_severi_human_san_model_2017_with_incompatible_units.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The unit of '1.2' in 'pow(Km_Kp/Ko, 1.2)' in '1.0+pow(Km_Kp/Ko, 1.2)' in 'pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)' in 'pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)' in 'i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)' in 'Iso_increase*i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)' in equation 'i_NaK = Iso_increase*i_NaK_max*pow(1.0+pow(Km_Kp/Ko, 1.2), -1.0)*pow(1.0+pow(Km_Nap/Nai, 1.3), -1.0)*pow(1.0+exp(-(V-E_Na+110.0)/20.0), -1.0)' in component 'i_NaK' is not dimensionless. '1.2' is in 'second'.",
        "The units in 'ACh > 0.0' in '(ACh > 0.0)?0.7*ACh/(0.00009+ACh)' in '(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0' in '(Iso_1_uM > 0.0)?-0.25:(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0' in equation 'b_up = (Iso_1_uM > 0.0)?-0.25:(ACh > 0.0)?0.7*ACh/(0.00009+ACh):0.0' in component 'Ca_intracellular_fluxes' are not equivalent. 'ACh' is in 'millimolar' (i.e. 'metre^-3 x mole') while '0.0' is in 'millimolar4' (i.e. 'metre^-12 x mole^4').",
        "The units in '-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)' in '(ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)' in '(ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423):0.0' in equation 'ACh_shift = (ACh > 0.0)?-1.0-9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423):0.0' in component 'i_f_y_gate' are not equivalent. '-1.0' is in 'millivolt' (i.e. '10^-3 x ampere^-1 x kilogram x metre^2 x second^-3') while '9.898*pow(1.0*ACh, 0.618)/(pow(1.0*ACh, 0.618)+0.00122423)' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in '0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift)))' in '1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))' in '1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))-0.054' in equation 'tau_y = 1.0/(0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)+0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift))))-0.054' in component 'i_f_y_gate' are not equivalent. '0.36*(V+148.8-ACh_shift-Iso_shift)/(exp(0.066*(V+148.8-ACh_shift-Iso_shift))-1.0)' is 'dimensionless' while '0.1*(V+87.3-ACh_shift-Iso_shift)/(1.0-exp(-0.2*(V+87.3-ACh_shift-Iso_shift)))' is in 'millivolt x per_millivolt_second' (i.e. 'second^-1').",
        "The units in '0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))' in '(V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))' in '(V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752)):0.0002501*exp(-(V-ACh_shift-Iso_shift-y_shift)/12.861)' in equation 'y_infinity = (V < -(80.0-ACh_shift-Iso_shift-y_shift))?0.01329+0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752)):0.0002501*exp(-(V-ACh_shift-Iso_shift-y_shift)/12.861)' in component 'i_f_y_gate' are not equivalent. '0.01329' is 'dimensionless' while '0.99921/(1.0+exp((V+97.134-ACh_shift-Iso_shift-y_shift)/8.1752))' is in 'ampere'.",
        "The units in 'V+42.0504' in '-(V+42.0504)' in '-(V+42.0504)/8.3106' in 'exp(-(V+42.0504)/8.3106)' in '1.0+exp(-(V+42.0504)/8.3106)' in '1.0/(1.0+exp(-(V+42.0504)/8.3106))' in equation 'm_infinity = 1.0/(1.0+exp(-(V+42.0504)/8.3106))' in component 'i_Na_m_gate' are not equivalent. 'V' is in 'millivolt' (i.e. '10^-3 x ampere^-1 x kilogram x metre^2 x second^-3') while '42.0504' is in 'per_millivolt' (i.e. '10^3 x ampere x kilogram^-1 x metre^-2 x second^3').",
        "The units in '1.0+exp((V+69.804)/4.4565)' in '1.0/(1.0+exp((V+69.804)/4.4565))' in equation 'h_infinity = 1.0/(1.0+exp((V+69.804)/4.4565))' in component 'i_Na_h_gate' are not equivalent. '1.0' is 'dimensionless' while 'exp((V+69.804)/4.4565)' is in 'millivolt x volt^-1' (i.e. '10^-3').",
        "The units in '320.0*exp(-0.1*(V+75.0))+1.0' in '2000.0/(320.0*exp(-0.1*(V+75.0))+1.0)' in equation 'beta_h = 2000.0/(320.0*exp(-0.1*(V+75.0))+1.0)' in component 'i_Na_h_gate' are not equivalent. '320.0*exp(-0.1*(V+75.0))' is in 'millivolt x per_millivolt x per_second' (i.e. 'second^-1') while '1.0' is 'dimensionless'.",
        "The units in 'i_CaL = (i_siCa+i_siK+i_siNa)*(1.0-ACh_block)*1.0*Iso_increase' in component 'i_CaL' are not equivalent. 'i_CaL' is in 'nanoA' (i.e. '10^-9 x ampere') while '(i_siCa+i_siK+i_siNa)*(1.0-ACh_block)*1.0*Iso_increase' is in 'millivolt x nanoA' (i.e. '10^-12 x kilogram x metre^2 x second^-3').",
        "The units in '-0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)-0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)' in equation 'alpha_dL = -0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)-0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)' in component 'i_CaL_dL_gate' are not equivalent. '-0.02839*(adVm+41.8)/(exp(-(adVm+41.8)/2.5)-1.0)' is in 'millivolt x per_millivolt_second' (i.e. 'second^-1') while '0.0849*(adVm+6.8)/(exp(-(adVm+6.8)/4.8)-1.0)' is in 'millivolt x per_second' (i.e. '10^-3 x ampere^-1 x kilogram x metre^2 x second^-4').",
        "The unit of '-pow((V+36.0)/10.0, 2.0)' in 'exp(-pow((V+36.0)/10.0, 2.0))' in '230.0*exp(-pow((V+36.0)/10.0, 2.0))' in '44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0))' in '0.001*(44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0)))' in equation 'tau_fL = 0.001*(44.3+230.0*exp(-pow((V+36.0)/10.0, 2.0)))' in component 'i_CaL_fL_gate' is not dimensionless. '-pow((V+36.0)/10.0, 2.0)' is in 'ampere^-2 x millivolt^2' (i.e. '10^-6 x ampere^-4 x kilogram^2 x metre^4 x second^-6').",
        "The units in 'i_KACh = (ACh > 0.0)?ACh_on*g_KACh*(V-E_K)*(1.0+exp((V+20.0)/20.0))*a:0.0' in component 'i_KACh' are not equivalent. 'i_KACh' is in 'nanoA' (i.e. '10^-9 x ampere') while '(ACh > 0.0)?ACh_on*g_KACh*(V-E_K)*(1.0+exp((V+20.0)/20.0))*a:0.0' is in 'microS x millivolt' and 'ampere' (i.e. '10^-9 x ampere' and 'ampere').",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}